

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imagecodec.hpp
# Opt level: O1

uvec4 ImageCodec::decodeUINT_UINTVec<unsigned_char,1>(ImageCodec *param_1,void *ptr)

{
  return (anon_union_16_4_ea85571f_for_vec<4,_unsigned_int,_(glm::precision)0>_3)ZEXT116(*ptr);
}

Assistant:

static glm::uvec4 decodeUINT_UINTVec(const ImageCodec*, const void* ptr) {
        static_assert(std::is_unsigned_v<TYPE>);
        static_assert((COMPONENTS > 0) && (COMPONENTS <= 4));
        auto data = reinterpret_cast<const TYPE*>(ptr);
        glm::uvec4 result(0, 0, 0, 0);
        for (int i = 0; i < COMPONENTS; ++i)
            result[i] = data[i];
        return result;
    }